

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  int iVar1;
  FileDescriptor *pFVar2;
  pointer pcVar3;
  size_t sVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  
  pFVar2 = this->file_;
  iVar1 = *(int *)(pFVar2 + 0x58);
  if (0 < (long)iVar1) {
    plVar6 = *(long **)(pFVar2 + 0x60);
    pcVar3 = (this->classname_)._M_dataplus._M_p;
    sVar4 = (this->classname_)._M_string_length;
    uVar7 = 0;
    do {
      if ((((undefined8 *)*plVar6)[1] == sVar4) &&
         ((sVar4 == 0 || (iVar5 = bcmp(*(void **)*plVar6,pcVar3,sVar4), iVar5 == 0))))
      goto LAB_0019f7e7;
      uVar7 = uVar7 + 1;
      plVar6 = plVar6 + 7;
    } while (uVar7 < (ulong)(long)iVar1);
  }
  iVar1 = *(int *)(pFVar2 + 0x48);
  if (0 < (long)iVar1) {
    plVar6 = *(long **)(pFVar2 + 0x50);
    pcVar3 = (this->classname_)._M_dataplus._M_p;
    sVar4 = (this->classname_)._M_string_length;
    uVar7 = 0;
    do {
      if ((((undefined8 *)*plVar6)[1] == sVar4) &&
         ((sVar4 == 0 || (iVar5 = bcmp(*(void **)*plVar6,pcVar3,sVar4), iVar5 == 0))))
      goto LAB_0019f7e7;
      uVar7 = uVar7 + 1;
      plVar6 = plVar6 + 0xf;
    } while (uVar7 < (ulong)(long)iVar1);
  }
  iVar1 = *(int *)(pFVar2 + 0x68);
  if (0 < (long)iVar1) {
    plVar6 = *(long **)(pFVar2 + 0x70);
    pcVar3 = (this->classname_)._M_dataplus._M_p;
    sVar4 = (this->classname_)._M_string_length;
    uVar7 = 0;
    do {
      if ((((undefined8 *)*plVar6)[1] == sVar4) &&
         ((sVar4 == 0 || (iVar5 = bcmp(*(void **)*plVar6,pcVar3,sVar4), iVar5 == 0)))) {
LAB_0019f7e7:
        std::__cxx11::string::_M_assign((string *)error);
        std::__cxx11::string::append((char *)error);
        std::__cxx11::string::_M_append((char *)error,(ulong)(this->classname_)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)error);
        return false;
      }
      uVar7 = uVar7 + 1;
      plVar6 = plVar6 + 6;
    } while (uVar7 < (ulong)(long)iVar1);
  }
  return true;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.

  bool found_conflict = false;
  for (int i = 0; i < file_->enum_type_count() && !found_conflict; i++) {
    if (file_->enum_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->message_type_count() && !found_conflict; i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->service_count() && !found_conflict; i++) {
    if (file_->service(i)->name() == classname_) {
      found_conflict = true;
    }
  }

  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }

  return true;
}